

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# skynet_timer.c
# Opt level: O1

void skynet_timer_init(void)

{
  timer *ptVar1;
  link_list (*palVar2) [64];
  long lVar3;
  uint64_t uVar4;
  long lVar5;
  timespec ti;
  timespec local_20;
  
  ptVar1 = (timer *)malloc(0x3020);
  lVar5 = 0;
  memset(ptVar1,0,0x3020);
  do {
    *(undefined8 *)((long)&ptVar1->near[0].head.next + lVar5) = 0;
    *(long *)((long)&ptVar1->near[0].tail + lVar5) = (long)&ptVar1->near[0].head.next + lVar5;
    lVar5 = lVar5 + 0x18;
  } while (lVar5 != 0x1800);
  palVar2 = ptVar1->t;
  lVar5 = 0;
  do {
    lVar3 = 0;
    do {
      *(undefined8 *)((long)&(*palVar2)[0].head.next + lVar3) = 0;
      *(long *)((long)&(*palVar2)[0].tail + lVar3) = (long)&(*palVar2)[0].head.next + lVar3;
      lVar3 = lVar3 + 0x18;
    } while (lVar3 != 0x600);
    lVar5 = lVar5 + 1;
    palVar2 = palVar2 + 1;
  } while (lVar5 != 4);
  (ptVar1->lock).lock = 0;
  ptVar1->current = 0;
  TI = ptVar1;
  clock_gettime(0,&local_20);
  ptVar1->starttime = (uint32_t)local_20.tv_sec;
  ptVar1->current =
       (int)(SUB168(SEXT816(local_20.tv_nsec) * ZEXT816(0xd6bf94d5e57a42bd),8) >> 0x17) -
       ((int)(local_20.tv_nsec / -0x6769800000000000) + (int)(local_20.tv_nsec >> 0x3f));
  clock_gettime(4,&local_20);
  ptVar1 = TI;
  uVar4 = local_20.tv_nsec / 10000000 +
          CONCAT44(local_20.tv_sec._4_4_,(uint32_t)local_20.tv_sec) * 100;
  TI->current_point = uVar4;
  ptVar1->origin_point = uVar4;
  return;
}

Assistant:

static struct timer *
timer_create_timer() {
	struct timer *r=(struct timer *)skynet_malloc(sizeof(struct timer));
	memset(r,0,sizeof(*r));

	int i,j;

	for (i=0;i<TIME_NEAR;i++) {
		link_clear(&r->near[i]);
	}

	for (i=0;i<4;i++) {
		for (j=0;j<TIME_LEVEL;j++) {
			link_clear(&r->t[i][j]);
		}
	}

	SPIN_INIT(r)

	r->current = 0;

	return r;
}